

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

iterator __thiscall
ft::list<int,_ft::allocator<int>_>::insert
          (list<int,_ft::allocator<int>_> *this,iterator *position,value_type_conflict *val)

{
  pointer p;
  Node *pNVar1;
  node *in_RCX;
  Node *extraout_RDX;
  iterator iVar2;
  listNode<int> local_48;
  pointer local_30;
  node *newNode;
  value_type_conflict *val_local;
  iterator *position_local;
  list<int,_ft::allocator<int>_> *this_local;
  
  newNode = in_RCX;
  val_local = val;
  position_local = position;
  this_local = this;
  p = allocator<ft::listNode<int>_>::allocate
                ((allocator<ft::listNode<int>_> *)&position[1].m_node,1);
  local_30 = p;
  listNode<int>::listNode(&local_48,&newNode->data);
  allocator<ft::listNode<int>_>::construct
            ((allocator<ft::listNode<int>_> *)&position[1].m_node,p,&local_48);
  listNode<int>::~listNode(&local_48);
  pNVar1 = listIterator<int>::node((listIterator<int> *)val);
  local_30->next = pNVar1;
  pNVar1 = listIterator<int>::node((listIterator<int> *)val);
  local_30->prev = pNVar1->prev;
  local_30->prev->next = local_30;
  local_30->next->prev = local_30;
  position[1]._vptr_listIterator = (_func_int **)((long)position[1]._vptr_listIterator + 1);
  listIterator<int>::listIterator((listIterator<int> *)this,local_30);
  iVar2.m_node = extraout_RDX;
  iVar2._vptr_listIterator = (_func_int **)this;
  return iVar2;
}

Assistant:

iterator	insert(iterator position, value_type const & val) {
		node*	newNode = this->m_alloc.allocate(1);
		this->m_alloc.construct(newNode, val);
		newNode->next = position.node();
		newNode->prev = position.node()->prev;
		newNode->prev->next = newNode;
		newNode->next->prev = newNode;
		++this->m_size;
		return iterator(newNode);
	}